

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

String * Rml::Parse::VariableExpression
                   (String *__return_storage_ptr__,DataParser *parser,String *address_prefix)

{
  bool *in_RCX;
  allocator<char> local_179;
  String prefix;
  String index;
  ProgramState backup_state;
  String local_128;
  Variant local_108;
  Variant local_e0;
  Variant local_b8;
  Variant local_90;
  Variant local_68;
  String local_40;
  
  if (parser->reached_end == false) {
    in_RCX = (bool *)parser->index;
    if (in_RCX[(long)(parser->expression)._M_dataplus._M_p] == true) {
      DataParser::Next(parser);
      ::std::operator+(&prefix,address_prefix,".");
      VariableExpression(__return_storage_ptr__,parser,&prefix);
      goto LAB_0026159a;
    }
    if (in_RCX[(long)(parser->expression)._M_dataplus._M_p] != true) goto LAB_0026137e;
    DataParser::Next(parser);
    ::std::__cxx11::string::string((string *)&prefix,(string *)address_prefix);
    ::std::__cxx11::string::push_back((char)&prefix);
    backup_state.program_length =
         ((long)(parser->program).
                super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x30;
    backup_state.stack_size = parser->program_stack_size;
    FindNumberLiteral_abi_cxx11_
              (&index,(Parse *)parser,(DataParser *)0x1,SUB41(backup_state.stack_size,0));
    if (((index._M_string_length == 0) || (parser->reached_end != false)) ||
       ((parser->expression)._M_dataplus._M_p[parser->index] != ']')) {
      DataParser::SetProgramState(parser,&backup_state);
      Variant::Variant<std::__cxx11::string&,void>(&local_68,&prefix);
      DataParser::Emit(parser,Literal,&local_68);
      Variant::~Variant(&local_68);
      DataParser::Push(parser);
      Expression(parser);
      Variant::Variant(&local_90);
      DataParser::Emit(parser,CastToInt,&local_90);
      Variant::~Variant(&local_90);
      DataParser::Push(parser);
      DataParser::Match(parser,']',true);
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"]",&local_179);
      VariableExpression(&local_40,parser,&local_128);
      ::std::__cxx11::string::~string((string *)&local_40);
      ::std::__cxx11::string::~string((string *)&local_128);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_b8);
      DataParser::Emit(parser,Add,&local_b8);
      Variant::~Variant(&local_b8);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_e0);
      DataParser::Emit(parser,Add,&local_e0);
      Variant::~Variant(&local_e0);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_128);
    }
    else {
      DataParser::Next(parser);
      ::std::__cxx11::string::append((string *)&prefix);
      ::std::__cxx11::string::push_back((char)&prefix);
      VariableExpression(__return_storage_ptr__,parser,&prefix);
    }
  }
  else {
LAB_0026137e:
    VariableOrFunctionName_abi_cxx11_(&prefix,(Parse *)parser,(DataParser *)0x0,in_RCX);
    if (prefix._M_string_length == 0) {
      if (address_prefix->_M_string_length != 0) {
        Variant::Variant<std::__cxx11::string_const&,void>(&local_108,address_prefix);
        DataParser::Emit(parser,Literal,&local_108);
        Variant::~Variant(&local_108);
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)address_prefix);
      goto LAB_0026159a;
    }
    ::std::operator+(&index,address_prefix,&prefix);
    VariableExpression(__return_storage_ptr__,parser,&index);
  }
  ::std::__cxx11::string::~string((string *)&index);
LAB_0026159a:
  ::std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

static String VariableExpression(DataParser& parser, const String& address_prefix)
	{
		if (parser.Look() == '[')
		{
			parser.Next();
			String prefix = address_prefix;

			prefix.push_back('[');

			// Backup program state before trying to parse number inside brackets.
			// Could turn out to be expression and needs reparsing
			auto backup_state = parser.GetProgramState();

			String index = FindNumberLiteral(parser, true);
			if (!index.empty() && parser.Look() == ']')
			{
				parser.Next();
				prefix.append(index);
				prefix.push_back(']');
				return VariableExpression(parser, prefix);
			}
			else
			{
				parser.SetProgramState(backup_state);

				parser.Emit(Instruction::Literal, Variant(prefix));
				parser.Push();

				Expression(parser);
				parser.Emit(Instruction::CastToInt);
				parser.Push();

				parser.Match(']');
				VariableExpression(parser, "]");

				parser.Pop(Register::L);
				parser.Emit(Instruction::Add, Variant());
				parser.Pop(Register::L);
				parser.Emit(Instruction::Add, Variant());

				return "";
			}
		}
		else if (parser.Look() == '.')
		{
			parser.Next();
			return VariableExpression(parser, address_prefix + ".");
		}
		else
		{
			String next = VariableOrFunctionName(parser, nullptr);
			if (next.empty())
			{
				if (!address_prefix.empty())
					parser.Emit(Instruction::Literal, Variant(address_prefix));
				return address_prefix;
			}
			return VariableExpression(parser, address_prefix + next);
		}
	}